

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_json.hpp
# Opt level: O0

type jsoncons::
     encode_json<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,char>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *val,
               basic_ostream<char,_std::char_traits<char>_> *os,
               basic_json_encode_options<char> *options,indenting indent)

{
  char in_CL;
  basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> encoder_1;
  basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> encoder;
  basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
  *in_stack_fffffffffffffb10;
  basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> *this;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffb28;
  stream_sink<char> *in_stack_fffffffffffffb30;
  allocator<char> *in_stack_fffffffffffffb38;
  basic_json_encode_options<char> *in_stack_fffffffffffffb40;
  stream_sink<char> *in_stack_fffffffffffffb48;
  basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
  *in_stack_fffffffffffffb50;
  allocator<char> local_201 [25];
  allocator<char> *in_stack_fffffffffffffe18;
  basic_json_encode_options<char> *in_stack_fffffffffffffe20;
  stream_sink<char> *in_stack_fffffffffffffe28;
  basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
  *in_stack_fffffffffffffe30;
  
  if (in_CL == '\0') {
    stream_sink<char>::stream_sink(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    std::allocator<char>::allocator();
    basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
    basic_compact_json_encoder
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
               in_stack_fffffffffffffb38);
    std::allocator<char>::~allocator(local_201);
    stream_sink<char>::~stream_sink((stream_sink<char> *)in_stack_fffffffffffffb10);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffffb40,(basic_json_visitor<char> *)in_stack_fffffffffffffb38);
    basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
    ~basic_compact_json_encoder(in_stack_fffffffffffffb10);
  }
  else {
    stream_sink<char>::stream_sink(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    this = (basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> *)
           &stack0xfffffffffffffb37;
    std::allocator<char>::allocator();
    basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::basic_json_encoder
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
               in_stack_fffffffffffffe18);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb37);
    stream_sink<char>::~stream_sink((stream_sink<char> *)this);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffffb40,(basic_json_visitor<char> *)in_stack_fffffffffffffb38);
    basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
    ~basic_json_encoder(this);
  }
  return;
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value>::type
    encode_json(const T& val, std::basic_ostream<CharT>& os, 
        const basic_json_encode_options<CharT>& options = basic_json_encode_options<CharT>(),
        indenting indent = indenting::no_indent)
    {
        if (indent == indenting::no_indent)
        {
            basic_compact_json_encoder<CharT> encoder(os, options);
            val.dump(encoder);
        }
        else
        {
            basic_json_encoder<CharT> encoder(os, options);
            val.dump(encoder);
        }
    }